

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O0

vm_val_t * __thiscall ListArgs::get(ListArgs *this,vm_val_t *val)

{
  vm_val_t *in_RSI;
  long in_RDI;
  int unaff_retaddr;
  
  if ((*(int *)(in_RDI + 0x24) < 0) && (*(int *)(in_RDI + 0x20) == 1)) {
    *(undefined8 *)in_RSI = *(undefined8 *)(in_RDI + 0x10);
    in_RSI->val = *(anon_union_8_8_cb74652f_for_val *)(in_RDI + 0x18);
  }
  else if (*(int *)(in_RDI + 0x24) < *(int *)(in_RDI + 0x20)) {
    vm_val_t::set_nil(in_RSI);
  }
  else {
    vm_val_t::ll_index((vm_val_t *)this,val,unaff_retaddr);
  }
  return in_RSI;
}

Assistant:

virtual vm_val_t *get(vm_val_t *val)
    {
        if (len < 0 && idx == 1)
        {
            /* 
             *   we don't have a list, so pretend the value was wrapped in a
             *   single-element list by returning it at index 1
             */
            *val = lst;
        }
        else if (idx <= len)
        {
            /* we have a valid list and a valid index - get the element */
            VMGLOB_PTR(vmg);
            lst.ll_index(vmg_ val, idx);
        }
        else
        {
            /* we're past the end of the list - return nil */
            val->set_nil();
        }
        return val;
    }